

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableDeathTest_InsertMaxSizeOverflow_Test::TestBody
          (HashtableDeathTest_InsertMaxSizeOverflow_Test *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> l;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  reference pvVar4;
  length_error *anon_var_0_1;
  type e_1;
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  length_error *anon_var_0;
  type e;
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_> dhs;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_> shs;
  int i;
  vector<int,_std::allocator<int>_> test_data;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd48;
  allocator_type *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *in_stack_fffffffffffffd70;
  Type in_stack_fffffffffffffd7c;
  string *this_00;
  Message *in_stack_fffffffffffffdc8;
  AssertHelper *in_stack_fffffffffffffdd0;
  string local_208 [3];
  int *local_198;
  int *local_190;
  int *local_188;
  byte local_179;
  string local_178;
  undefined4 local_154;
  Alloc<int,_unsigned_char,_(unsigned_char)__n_> local_150;
  Hasher local_140;
  Hasher local_134 [7];
  Alloc<int,_unsigned_char,_(unsigned_char)__n_> local_d8;
  Hasher local_c8;
  Hasher local_bc [11];
  int local_38;
  
  std::allocator<int>::allocator((allocator<int> *)0x9e78d1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70,
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             (allocator_type *)in_stack_fffffffffffffd60._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x9e78f7);
  for (local_38 = 0; local_38 < 0x100; local_38 = local_38 + 1) {
    iVar3 = local_38 + 1000;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0,(long)local_38
                       );
    *pvVar4 = iVar3;
  }
  Hasher::Hasher(local_bc,0);
  Hasher::Hasher(&local_c8,0);
  Alloc<int,_unsigned_char,_(unsigned_char)'\n'>::Alloc(&local_d8,0,(int *)0x0);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  sparse_hash_set(in_stack_fffffffffffffd70,(size_type)((uint)in_stack_fffffffffffffd6c >> 0x18),
                  (hasher *)in_stack_fffffffffffffd60._M_current,
                  (key_equal *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                  in_stack_fffffffffffffd50);
  Alloc<int,_unsigned_char,_(unsigned_char)'\n'>::~Alloc(&local_d8);
  Hasher::Hasher(local_134,0);
  Hasher::Hasher(&local_140,0);
  Alloc<int,_unsigned_char,_(unsigned_char)'\n'>::Alloc(&local_150,0,(int *)0x0);
  google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  dense_hash_set((dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                  *)in_stack_fffffffffffffd70,(size_type)((uint)in_stack_fffffffffffffd6c >> 0x18),
                 (hasher *)in_stack_fffffffffffffd60._M_current,
                 (key_equal *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                 in_stack_fffffffffffffd50);
  Alloc<int,_unsigned_char,_(unsigned_char)'\n'>::~Alloc(&local_150);
  local_154 = 0xffffffff;
  google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  set_empty_key((dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                 *)in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
  local_178.field_2._M_allocated_capacity = 0;
  local_178.field_2._8_8_ = 0;
  local_178._M_dataplus = (_Alloc_hider)0x0;
  local_178._1_7_ = 0;
  local_178._M_string_length = 0;
  this_00 = &local_178;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)0x9e7a90);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)this_00);
  if (bVar1) {
    local_179 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffd7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd7c);
    if (bVar1) {
      in_stack_fffffffffffffd70 =
           (sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_> *)
           &stack0xffffffffffffffe0;
      local_188 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd48);
      local_198 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd48);
      local_190 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                                   (difference_type)in_stack_fffffffffffffd50);
      _Var5._M_current._7_1_ = in_stack_fffffffffffffd5f;
      _Var5._M_current._0_7_ = in_stack_fffffffffffffd58;
      google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                  *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd60,_Var5);
    }
    if ((local_179 & 1) != 0) goto LAB_009e7ea7;
    std::__cxx11::string::operator=
              ((string *)&local_178,
               "Expected: dhs.insert(test_data.begin(), test_data.begin() + 11) throws an exception of type std::length_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message((Message *)this_00);
  std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,in_stack_fffffffffffffd7c,(char *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd6c,(char *)in_stack_fffffffffffffd60._M_current);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
  testing::Message::~Message((Message *)0x9e7e5c);
LAB_009e7ea7:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)0x9e7eb4);
  local_208[0].field_2._M_allocated_capacity = 0;
  local_208[0].field_2._8_8_ = 0;
  local_208[0]._M_dataplus = (_Alloc_hider)0x0;
  local_208[0]._1_7_ = 0;
  local_208[0]._M_string_length = 0;
  _Var5._M_current = (int *)local_208;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)0x9e7ed9);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)_Var5._M_current);
  if (bVar1) {
    uVar2 = testing::internal::AlwaysTrue();
    if ((bool)uVar2) {
      in_stack_fffffffffffffd50 = (allocator_type *)&stack0xffffffffffffffe0;
      std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd48);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd48);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffd58),
                 (difference_type)in_stack_fffffffffffffd50);
      l._M_current._7_1_ = uVar2;
      l._M_current._0_7_ = in_stack_fffffffffffffd58;
      google::sparse_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_char,(unsigned_char)10>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                  *)in_stack_fffffffffffffd50,_Var5,l);
    }
    std::__cxx11::string::operator=
              ((string *)local_208,
               "Expected: shs.insert(test_data.begin(), test_data.begin() + 11) throws an exception of type std::length_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message((Message *)this_00);
  std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)this_00,in_stack_fffffffffffffd7c,(char *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd6c,(char *)_Var5._M_current);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
  testing::Message::~Message((Message *)0x9e81ff);
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)0x9e824e);
  google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  ~dense_hash_set((dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                   *)0x9e825b);
  google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::
  ~sparse_hash_set((sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                    *)0x9e8268);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)_Var5._M_current);
  return;
}

Assistant:

TEST(HashtableDeathTest, InsertMaxSizeOverflow) {
  static const int kMax = 256;
  vector<int> test_data(kMax);
  for (int i = 0; i < kMax; ++i) {
    test_data[i] = i + 1000;
  }

  sparse_hash_set<int, Hasher, Hasher, Alloc<int, uint8, 10>> shs;
  dense_hash_set<int, Hasher, Hasher, Alloc<int, uint8, 10>> dhs;
  dhs.set_empty_key(-1);

  // Test max_size overflow
  EXPECT_THROW(dhs.insert(test_data.begin(), test_data.begin() + 11),
               std::length_error);
  EXPECT_THROW(shs.insert(test_data.begin(), test_data.begin() + 11),
               std::length_error);
}